

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseDriveFormal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_Bundle_t *pBundle0)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj;
  char *__s2;
  Ver_Bundle_t *pBundle;
  void *pvVar5;
  void *Entry;
  int i;
  uint i_00;
  int i_01;
  int iVar6;
  char Buffer [200];
  
  i_00 = 0;
  while( true ) {
    if (pBundle0->vNetsActual->nSize <= (int)i_00) break;
    Vec_PtrEntry(pBundle0->vNetsActual,i_00);
    if (pBundle0->vNetsActual->nSize == 1) {
      strcpy(Buffer,pBundle0->pNameFormal);
    }
    else {
      sprintf(Buffer,"%s[%d]",pBundle0->pNameFormal,(ulong)i_00);
    }
    pAVar2 = Abc_NtkFindNet(pNtk,Buffer);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      __assert_fail("Abc_NtkFindNet( pNtk, Buffer ) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0xa00,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
    }
    pAVar2 = Abc_NtkFindOrCreateNet(pNtk,Buffer);
    pAVar3 = Abc_NtkCreateBo(pNtk);
    iVar6 = pNtk->vBoxes->nSize;
    if (1 < iVar6) {
      __assert_fail("Abc_NtkBoxNum(pNtk) <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0xa04,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
    }
    if (iVar6 == 0) {
      pAVar4 = Abc_NtkCreateBlackbox(pNtk);
    }
    else {
      pAVar4 = Abc_NtkBox(pNtk,0);
    }
    pObj = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pObj,pAVar2);
    Abc_ObjAddFanin(pAVar2,pAVar3);
    Abc_ObjAddFanin(pAVar3,pAVar4);
    i_00 = i_00 + 1;
  }
  __s2 = Extra_UtilStrsav(pBundle0->pNameFormal);
  pBundle = (Ver_Bundle_t *)0x0;
  iVar6 = 0;
  do {
    if (((Vec_Ptr_t *)pNtk->pData)->nSize <= iVar6) {
      free(__s2);
      return 1;
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,iVar6);
    pAVar2 = (pAVar3->field_6).pCopy;
    iVar1 = *(int *)((long)&pAVar2->pNtk + 4);
    while (i = iVar1 + -1, 0 < iVar1) {
      pBundle = (Ver_Bundle_t *)Vec_PtrEntry((Vec_Ptr_t *)pAVar2,i);
      if ((pBundle != (Ver_Bundle_t *)0x0) &&
         (iVar1 = strcmp(pBundle->pNameFormal,__s2), iVar1 == 0)) {
        pAVar2 = (pAVar3->field_6).pCopy;
        break;
      }
      pAVar2 = (pAVar3->field_6).pCopy;
      iVar1 = i;
    }
    if (*(int *)((long)&pAVar2->pNtk + 4) != i) {
      if (pBundle == (Ver_Bundle_t *)0x0) {
        __assert_fail("pBundle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa17,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      iVar1 = 0;
      while( true ) {
        i_01 = pBundle->vNetsActual->nSize;
        if (i_01 <= iVar1) break;
        pvVar5 = Vec_PtrEntry(pBundle->vNetsActual,iVar1);
        iVar1 = iVar1 + 1;
        if (0 < *(int *)((long)pvVar5 + 0x1c)) {
          sprintf(pMan->sError,"Missing specification of the I/Os of undefined box \"%s\".",
                  pNtk->pName);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
      }
      while (0 < i_01) {
        i_01 = i_01 + -1;
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pBundle->vNetsActual,i_01);
        pAVar4 = Abc_NtkCreateBo(pAVar2->pNtk);
        Abc_ObjAddFanin(pAVar4,pAVar3);
        Abc_ObjAddFanin(pAVar2,pAVar4);
      }
      Ver_ParseFreeBundle(pBundle);
      Vec_PtrWriteEntry((Vec_Ptr_t *)(pAVar3->field_6).pCopy,i,Entry);
      pBundle = (Ver_Bundle_t *)0x0;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int Ver_ParseDriveFormal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_Bundle_t * pBundle0 )
{
    char Buffer[200];
    char * pName;
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pTerm, * pTermNew, * pNetAct, * pNetFormal;
    int k, j, m;

    // drive this net in the undef box
    Vec_PtrForEachEntry( Abc_Obj_t *, pBundle0->vNetsActual, pNetAct, m )
    {
        // create the formal net
        if ( Vec_PtrSize(pBundle0->vNetsActual) == 1 )
            sprintf( Buffer, "%s", pBundle0->pNameFormal );
        else
            sprintf( Buffer, "%s[%d]", pBundle0->pNameFormal, m );
        assert( Abc_NtkFindNet( pNtk, Buffer ) == NULL );
        pNetFormal = Abc_NtkFindOrCreateNet( pNtk, Buffer );
        // connect it to the box
        pTerm = Abc_NtkCreateBo( pNtk );
        assert( Abc_NtkBoxNum(pNtk) <= 1 );
        pBox = Abc_NtkBoxNum(pNtk)? Abc_NtkBox(pNtk,0) : Abc_NtkCreateBlackbox(pNtk);
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNetFormal );
        Abc_ObjAddFanin( pNetFormal, pTerm );
        Abc_ObjAddFanin( pTerm, pBox );
    }

    // go through instances of this type
    pName = Extra_UtilStrsav(pBundle0->pNameFormal);
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pName ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if any nets are driven in this bundle
        assert(pBundle); // Verify pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
            if ( Abc_ObjFaninNum(pNetAct) > 0 )
            {
                sprintf( pMan->sError, "Missing specification of the I/Os of undefined box \"%s\".", Abc_NtkName(pNtk) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
        // drive the nets by the undef box
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
        {
            pTermNew = Abc_NtkCreateBo( pNetAct->pNtk );
            Abc_ObjAddFanin( pTermNew, pBox );
            Abc_ObjAddFanin( pNetAct, pTermNew );
        }
        // remove the bundle
        Ver_ParseFreeBundle( pBundle ); pBundle = NULL;
        Vec_PtrWriteEntry( (Vec_Ptr_t *)pBox->pCopy, j, NULL );
    }
    ABC_FREE( pName );
    return 1;
}